

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

void __thiscall
ParamEntry::restoreXml(ParamEntry *this,Element *el,AddrSpaceManager *manage,bool normalstack)

{
  int4 *piVar1;
  int4 *piVar2;
  int iVar3;
  type_metatype tVar4;
  JoinRecord *pJVar5;
  LowlevelError *pLVar6;
  uint uVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar9;
  Address AVar10;
  istringstream i6;
  undefined1 local_1b0 [24];
  uint auStack_198 [24];
  ios_base local_138 [264];
  
  this->flags = 0;
  this->type = TYPE_UNKNOWN;
  piVar1 = &this->size;
  this->size = -1;
  this->minsize = -1;
  piVar2 = &this->alignment;
  this->alignment = 0;
  this->numslots = 1;
  this->groupsize = 1;
  uVar7 = (uint)((ulong)((long)(el->attr).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(el->attr).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar7) {
    uVar8 = (ulong)(uVar7 & 0x7fffffff);
    lVar9 = 0;
    do {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(((el->attr).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9);
      iVar3 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar3 == 0) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_1b0,
                   (string *)
                   ((long)&(((el->value).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9),
                   _S_in);
        *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) =
             *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) & 0xffffffb5;
        std::istream::operator>>((istringstream *)local_1b0,&this->minsize);
LAB_0025534a:
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar3 == 0) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1b0,
                     (string *)
                     ((long)&(((el->value).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     ),_S_in);
          *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) =
               *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) & 0xffffffb5;
          std::istream::operator>>((istringstream *)local_1b0,piVar2);
          goto LAB_0025534a;
        }
        iVar3 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar3 == 0) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1b0,
                     (string *)
                     ((long)&(((el->value).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     ),_S_in);
          *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) =
               *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) & 0xffffffb5;
          std::istream::operator>>((istringstream *)local_1b0,piVar2);
          goto LAB_0025534a;
        }
        iVar3 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar3 == 0) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1b0,
                     (string *)
                     ((long)&(((el->value).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     ),_S_in);
          *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) =
               *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) & 0xffffffb5;
          std::istream::operator>>((istringstream *)local_1b0,piVar1);
          goto LAB_0025534a;
        }
        iVar3 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar3 == 0) {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_1b0,
                       (string *)
                       ((long)&(((el->value).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar9),_S_in);
            *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) =
                 *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) & 0xffffffb5;
            std::istream::operator>>((istringstream *)local_1b0,&this->group);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar3 != 0) {
                pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b0,"Unknown ParamEntry attribute: ",__rhs);
                LowlevelError::LowlevelError(pLVar6,(string *)local_1b0);
                __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
              }
              *(byte *)&this->flags = (byte)this->flags & 0xd3;
              iVar3 = std::__cxx11::string::compare
                                ((char *)((long)&(((el->value).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar9));
              if (iVar3 == 0) {
                *(byte *)&this->flags = (byte)this->flags | 8;
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)((long)&(((el->value).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar9));
                if (iVar3 == 0) {
                  *(byte *)&this->flags = (byte)this->flags | 4;
                }
                else {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)((long)&(((el->value).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar9));
                  if (iVar3 == 0) {
                    *(byte *)&this->flags = (byte)this->flags | 0x20;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare
                                      ((char *)((long)&(((el->value).
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar9));
                    if (iVar3 == 0) {
                      *(byte *)&this->flags = (byte)this->flags | 0x40;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare
                                        ((char *)((long)&(((el->value).
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar9));
                      if (iVar3 != 0) {
                        pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
                        local_1b0._0_8_ = local_1b0 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1b0,"Bad extension attribute","");
                        LowlevelError::LowlevelError(pLVar6,(string *)local_1b0);
                        __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
                      }
                    }
                  }
                }
              }
              goto LAB_00255366;
            }
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_1b0,
                       (string *)
                       ((long)&(((el->value).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar9),_S_in);
            *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) =
                 *(uint *)((long)auStack_198 + *(long *)(local_1b0._0_8_ + -0x18)) & 0xffffffb5;
            std::istream::operator>>((istringstream *)local_1b0,&this->groupsize);
          }
          goto LAB_0025534a;
        }
        tVar4 = string2metatype((string *)
                                ((long)&(((el->value).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar9));
        this->type = tVar4;
      }
LAB_00255366:
      lVar9 = lVar9 + 0x20;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if ((*piVar1 == -1) || (this->minsize == -1)) {
    pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ParamEntry not fully specified","");
    LowlevelError::LowlevelError(pLVar6,(string *)local_1b0);
    __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (*piVar2 == *piVar1) {
    *piVar2 = 0;
  }
  AVar10 = Address::restoreXml((Address *)local_1b0,
                               *(el->children).
                                super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
                                super__Vector_impl_data._M_start,manage);
  uVar8 = AVar10.offset;
  this->spaceid = (AddrSpace *)local_1b0._0_8_;
  this->addressbase = local_1b0._8_8_;
  iVar3 = this->alignment;
  if (iVar3 != 0) {
    uVar8 = (long)this->size % (long)iVar3 & 0xffffffff;
    this->numslots = this->size / iVar3;
  }
  if ((*(uint4 *)(local_1b0._0_8_ + 0x24) & 0x10) != 0) {
    if ((*(uint4 *)(local_1b0._0_8_ + 0x24) & 1) == 0) {
      pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20,local_1b0._8_8_,uVar8);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"No support for right justification in little endian encoding",
                 "");
      LowlevelError::LowlevelError(pLVar6,(string *)local_1b0);
      __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    *(byte *)&this->flags = (byte)this->flags | 1;
  }
  if (((!normalstack) && (*(byte *)&this->flags = (byte)this->flags | 2, iVar3 != 0)) &&
     (*piVar1 % iVar3 != 0)) {
    pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"For positive stack growth, <pentry> size must match alignment",
               "");
    LowlevelError::LowlevelError(pLVar6,(string *)local_1b0);
    __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (*(spacetype *)(local_1b0._0_8_ + 8) == IPTR_JOIN) {
    pJVar5 = AddrSpaceManager::findJoin
                       (*(AddrSpaceManager **)(local_1b0._0_8_ + 0x10),local_1b0._8_8_);
  }
  else {
    pJVar5 = (JoinRecord *)0x0;
  }
  this->joinrec = pJVar5;
  return;
}

Assistant:

void ParamEntry::restoreXml(const Element *el,const AddrSpaceManager *manage,bool normalstack)

{
  flags = 0;
  type = TYPE_UNKNOWN;
  size = minsize = -1;		// Must be filled in
  alignment = 0;		// default
  numslots = 1;
  groupsize = 1;		// default
  int4 num = el->getNumAttributes();
  
  for(int4 i=0;i<num;++i) {
    const string &attrname( el->getAttributeName(i) );
    if (attrname=="minsize") {
      istringstream i1(el->getAttributeValue(i));
      i1.unsetf(ios::dec | ios::hex | ios::oct);
      i1 >> minsize;
    }
    else if (attrname == "size") { // old style
      istringstream i2(el->getAttributeValue(i));
      i2.unsetf(ios::dec | ios::hex | ios::oct);
      i2 >> alignment;
    }
    else if (attrname == "align") { // new style
      istringstream i4(el->getAttributeValue(i));
      i4.unsetf(ios::dec | ios::hex | ios::oct);
      i4 >> alignment;
    }
    else if (attrname == "maxsize") {
      istringstream i3(el->getAttributeValue(i));
      i3.unsetf(ios::dec | ios::hex | ios::oct);
      i3 >> size;
    }
    else if (attrname == "metatype")
      type = string2metatype(el->getAttributeValue(i));
    else if (attrname == "group") { // Override the group
      istringstream i5(el->getAttributeValue(i));
      i5.unsetf(ios::dec | ios::hex | ios::oct);
      i5 >> group;
    }
    else if (attrname == "groupsize") {
      istringstream i6(el->getAttributeValue(i));
      i6.unsetf(ios::dec | ios::hex | ios::oct);
      i6 >> groupsize;
    }
    else if (attrname == "extension") {
      flags &= ~((uint4)(smallsize_zext | smallsize_sext | smallsize_inttype));
      if (el->getAttributeValue(i) == "sign")
	flags |= smallsize_sext;
      else if (el->getAttributeValue(i) == "zero")
	flags |= smallsize_zext;
      else if (el->getAttributeValue(i) == "inttype")
	flags |= smallsize_inttype;
      else if (el->getAttributeValue(i) == "float")
	flags |= smallsize_floatext;
      else if (el->getAttributeValue(i) != "none")
	throw LowlevelError("Bad extension attribute");
    }
    else
      throw LowlevelError("Unknown ParamEntry attribute: "+attrname);
  }
  if ((size==-1)||(minsize==-1))
    throw LowlevelError("ParamEntry not fully specified");
  if (alignment == size)
    alignment = 0;
  Address addr;
  addr = Address::restoreXml( *el->getChildren().begin(),manage);
  spaceid = addr.getSpace();
  addressbase = addr.getOffset();
  if (alignment != 0) {
//    if ((addressbase % alignment) != 0)
//      throw LowlevelError("Stack <pentry> address must match alignment");
    numslots = size / alignment;
  }
  if (spaceid->isReverseJustified()) {
    if (spaceid->isBigEndian())
      flags |= force_left_justify;
    else
      throw LowlevelError("No support for right justification in little endian encoding");
  }
  if (!normalstack) {
    flags |= reverse_stack;
    if (alignment != 0) {
      if ((size % alignment) != 0)
	throw LowlevelError("For positive stack growth, <pentry> size must match alignment");
    }
  }
  resolveJoin();
}